

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::productTransposeQuad
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result_value,
          vector<int,_std::allocator<int>_> *result_index,HVector *column,HighsInt debug_report)

{
  int *piVar1;
  int iVar2;
  double dVar3;
  vector<double,_std::allocator<double>_> *this_00;
  vector<int,_std::allocator<int>_> *pvVar4;
  pointer piVar5;
  long lVar6;
  long lVar7;
  size_type __new_size;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  pointer extraout_XMM0_Qa;
  pointer pHVar11;
  HighsCDouble HVar12;
  HighsSparseVectorSum sum;
  HighsSparseVectorSum report_sum;
  int local_b4;
  vector<double,_std::allocator<double>_> *local_b0;
  vector<int,_std::allocator<int>_> *local_a8;
  double local_a0;
  HighsSparseVectorSum local_98;
  HighsSparseVectorSum local_60;
  
  if (-2 < debug_report) {
    puts("\nHighsSparseMatrix::productTranspose:");
  }
  if (this->format_ == kColwise) {
    std::vector<double,_std::allocator<double>_>::reserve(result_value,(long)this->num_col_);
    std::vector<int,_std::allocator<int>_>::reserve(result_index,(long)this->num_col_);
    for (local_b4 = 0; local_b4 < this->num_col_; local_b4 = local_b4 + 1) {
      local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      piVar5 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar6 = (long)piVar5[local_b4]; lVar6 < piVar5[(long)local_b4 + 1]; lVar6 = lVar6 + 1) {
        dVar3 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start
                [(this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6]] *
                (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        pHVar11 = (pointer)((double)local_98.values.
                                    super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                    _M_impl.super__Vector_impl_data._M_start + dVar3);
        local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((double)local_98.values.
                               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                               _M_impl.super__Vector_impl_data._M_finish +
                      ((double)local_98.values.
                               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                               _M_impl.super__Vector_impl_data._M_start - ((double)pHVar11 - dVar3))
                      + (dVar3 - ((double)pHVar11 - ((double)pHVar11 - dVar3))));
        local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start = pHVar11;
      }
      pHVar11 = local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                _M_impl.super__Vector_impl_data._M_start;
      abs((int)&local_98);
      local_60.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_start = extraout_XMM0_Qa;
      local_60.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_finish = pHVar11;
      HVar12 = HighsCDouble::operator-((HighsCDouble *)&local_60,1e-14);
      if (0.0 < HVar12.lo + HVar12.hi) {
        local_60.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((double)local_98.values.
                               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                               _M_impl.super__Vector_impl_data._M_start +
                      (double)local_98.values.
                              super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (result_value,(double *)&local_60);
        std::vector<int,_std::allocator<int>_>::push_back(result_index,&local_b4);
      }
    }
  }
  else {
    local_b0 = result_value;
    local_a8 = result_index;
    HighsSparseVectorSum::HighsSparseVectorSum(&local_98,this->num_col_);
    lVar6 = 0;
    while (lVar6 < this->num_row_) {
      local_a0 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6];
      piVar5 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = piVar5 + lVar6;
      lVar6 = lVar6 + 1;
      for (lVar7 = (long)*piVar1; lVar7 < piVar5[lVar6]; lVar7 = lVar7 + 1) {
        HighsSparseVectorSum::add
                  (&local_98,
                   (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7],
                   (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7] * local_a0);
        piVar5 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
    }
    if (-2 < debug_report) {
      HighsSparseVectorSum::HighsSparseVectorSum(&local_60,this->num_col_);
      for (uVar10 = 0; (long)uVar10 < (long)this->num_row_; uVar10 = uVar10 + 1) {
        if (debug_report == -1 || (uint)debug_report == uVar10) {
          debugReportRowPrice(this,(HighsInt)uVar10,
                              (column->array).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar10],
                              (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar10 + 1],&local_60);
        }
      }
      HighsSparseVectorSum::~HighsSparseVectorSum(&local_60);
    }
    pvVar4 = local_a8;
    this_00 = local_b0;
    uVar10 = (ulong)((long)local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start) >> 2;
    uVar8 = uVar10 & 0xffffffff;
    while( true ) {
      __new_size = (size_type)(int)uVar10;
      if ((int)uVar8 < 1) break;
      iVar9 = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8 - 1];
      uVar8 = uVar8 - 1;
      if (ABS(local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar9].hi +
              local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar9].lo) <= 1e-14) {
        uVar10 = (ulong)((int)uVar10 - 1);
        local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start[iVar9].hi = 0.0;
        local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start[iVar9].lo = 0.0;
        iVar2 = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[__new_size - 1];
        local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[__new_size - 1] = iVar9;
        local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = iVar2;
      }
    }
    std::vector<int,_std::allocator<int>_>::resize(&local_98.nonzeroinds,__new_size);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(pvVar4,&local_98.nonzeroinds);
    uVar10 = (ulong)((long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    iVar9 = (int)uVar10;
    std::vector<double,_std::allocator<double>_>::reserve(this_00,(long)iVar9);
    uVar8 = 0;
    uVar10 = uVar10 & 0xffffffff;
    if (iVar9 < 1) {
      uVar10 = uVar8;
    }
    for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      iVar9 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      local_60.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar9].hi +
                    local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar9].lo);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (this_00,(double *)&local_60);
    }
    HighsSparseVectorSum::~HighsSparseVectorSum(&local_98);
  }
  return;
}

Assistant:

void HighsSparseMatrix::productTransposeQuad(
    vector<double>& result_value, vector<HighsInt>& result_index,
    const HVector& column, const HighsInt debug_report) const {
  if (debug_report >= kDebugReportAll)
    printf("\nHighsSparseMatrix::productTranspose:\n");
  if (this->isColwise()) {
    result_value.reserve(this->num_col_);
    result_index.reserve(this->num_col_);
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      HighsCDouble value = 0.0;
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        value += column.array[this->index_[iEl]] * this->value_[iEl];

      if (abs(value) - kHighsTiny > 0.0) {
        result_value.push_back(double(value));
        result_index.push_back(iCol);
      }
    }
  } else {
    HighsSparseVectorSum sum(num_col_);
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      double multiplier = column.array[iRow];
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++)
        sum.add(this->index_[iEl], multiplier * this->value_[iEl]);
    }
    if (debug_report >= kDebugReportAll) {
      HighsSparseVectorSum report_sum(num_col_);
      for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
        double multiplier = column.array[iRow];
        if (debug_report == kDebugReportAll || debug_report == iRow)
          debugReportRowPrice(iRow, multiplier, this->start_[iRow + 1],
                              report_sum);
      }
    }

    sum.cleanup([](HighsInt, double x) { return std::abs(x) <= kHighsTiny; });
    result_index = std::move(sum.nonzeroinds);
    HighsInt result_num_nz = result_index.size();
    result_value.reserve(result_num_nz);
    for (HighsInt i = 0; i < result_num_nz; ++i)
      result_value.push_back(sum.getValue(result_index[i]));
  }
}